

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O0

int __thiscall HydEngine::getTimeStep(HydEngine *this)

{
  int iVar1;
  long lVar2;
  int t;
  int n;
  int local_34;
  string local_30 [4];
  int tstep;
  string reason;
  HydEngine *this_local;
  
  std::__cxx11::string::string(local_30);
  lVar2 = Network::option(this->network,HYD_STEP);
  local_34 = (this->currentTime / (int)lVar2 + 1) * (int)lVar2 - this->currentTime;
  std::__cxx11::string::operator=((string *)&this->timeStepReason,"");
  iVar1 = this->rptTime - this->currentTime;
  if ((0 < iVar1) && (iVar1 < local_34)) {
    std::__cxx11::string::operator=((string *)&this->timeStepReason,"");
    local_34 = iVar1;
  }
  iVar1 = timeToPatternChange(this,local_34);
  iVar1 = timeToCloseTank(this,iVar1);
  iVar1 = timeToActivateControl(this,iVar1);
  std::__cxx11::string::~string(local_30);
  return iVar1;
}

Assistant:

int HydEngine::getTimeStep()
{
    // ... normal time step is user-supplied hydraulic time step

    string reason ;
    int tstep = network->option(Options::HYD_STEP);
    int n = currentTime / tstep + 1;
    tstep = n * tstep - currentTime;
    timeStepReason = "";

    // ... adjust for time until next reporting period

    int t = rptTime - currentTime;
    if ( t > 0 && t < tstep )
    {
        tstep = t;
        timeStepReason = "";
    }

    // ... adjust for time until next time pattern change

    tstep = timeToPatternChange(tstep);

    // ... adjust for shortest time to fill or drain a tank

    tstep = timeToCloseTank(tstep);

    // ... adjust for shortest time to activate a simple control

    tstep = timeToActivateControl(tstep);
    return tstep;
}